

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeVLD1DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar3 = Insn >> 6 & 3;
  if ((uVar3 == 0 & (byte)(Insn >> 4)) == 0) {
    uVar4 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 - 0x349 < 9) {
      lVar5 = 0;
      if (uVar4 != 0x1f) {
        MCOperand_CreateReg0(Inst,(uint)DPairDecoderTable[uVar4]);
        lVar5 = 3;
      }
      DVar2 = (*(code *)((long)&DAT_001d4910 + (long)(int)(&DAT_001d4910)[lVar5]))();
      return DVar2;
    }
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar4]);
    DVar2 = MCDisassembler_Success;
    uVar1 = Insn >> 0x10 & 0xf;
    uVar4 = Insn & 0xf;
    if (uVar4 != 0xf) {
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
    }
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
    MCOperand_CreateImm0(Inst,(ulong)((Insn >> 4 & 1) << (sbyte)uVar3));
    if ((uVar4 | 2) != 0xf) {
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
    }
  }
  else {
    DVar2 = MCDisassembler_Fail;
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVLD1DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, align, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	align = fieldFromInstruction_4(Insn, 4, 1);
	size = fieldFromInstruction_4(Insn, 6, 2);

	if (size == 0 && align == 1)
		return MCDisassembler_Fail;
	align *= (1 << size);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD1DUPq16: case ARM_VLD1DUPq32: case ARM_VLD1DUPq8:
		case ARM_VLD1DUPq16wb_fixed: case ARM_VLD1DUPq16wb_register:
		case ARM_VLD1DUPq32wb_fixed: case ARM_VLD1DUPq32wb_register:
		case ARM_VLD1DUPq8wb_fixed: case ARM_VLD1DUPq8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
	}
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	// The fixed offset post-increment encodes Rm == 0xd. The no-writeback
	// variant encodes Rm == 0xf. Anything else is a register offset post-
	// increment and we need to add the register operand to the instruction.
	if (Rm != 0xD && Rm != 0xF &&
			!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}